

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexpr.h
# Opt level: O2

SExpr * SExprParseValue(SExprParser *parser)

{
  int *piVar1;
  anon_union_8_5_1f899604_for_SExpr_2 aVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SExpr *pSVar7;
  char *pcVar8;
  SExpr *pSVar9;
  anon_union_8_5_1f899604_for_SExpr_2 *paVar10;
  SExpr *pSVar11;
  long lVar12;
  double dVar13;
  char buf [32];
  
  iVar5 = parser->last;
  while (iVar5 != 0) {
    iVar4 = isspace(iVar5);
    if (iVar4 == 0) {
      iVar4 = isalpha(iVar5);
      if (iVar4 != 0) {
        buf._0_4_ = parser->pos + -1;
        iVar4 = 0;
        while ((iVar6 = isalnum(iVar5), iVar6 != 0 ||
               ((iVar5 - 0x24U < 0x3c &&
                ((0x80000000a000ac1U >> ((ulong)(iVar5 - 0x24U) & 0x3f) & 1) != 0))))) {
          iVar4 = iVar4 + 1;
          iVar5 = SExprGetChar(parser);
          parser->last = iVar5;
        }
        pcVar8 = parser->src;
        buf._4_4_ = iVar4;
        bVar3 = SExprStringEqual(pcVar8,(SExprString *)buf,"true");
        if (!bVar3) {
          bVar3 = SExprStringEqual(pcVar8,(SExprString *)buf,"false");
          if (!bVar3) {
            pSVar7 = SExprAlloc(parser,SE_ID);
            aVar2._4_1_ = buf[4];
            aVar2._5_1_ = buf[5];
            aVar2._6_1_ = buf[6];
            aVar2._7_1_ = buf[7];
            aVar2._0_1_ = buf[0];
            aVar2._1_1_ = buf[1];
            aVar2._2_1_ = buf[2];
            aVar2._3_1_ = buf[3];
            pSVar7->field_2 = aVar2;
            return pSVar7;
          }
          SExprParseValue::sfalse.field_2.b = false;
          return &SExprParseValue::sfalse;
        }
        SExprParseValue::strue.field_2.b = true;
        return &SExprParseValue::strue;
      }
      if (iVar5 - 0x30U < 10) {
LAB_001056c3:
        lVar12 = 0;
        bVar3 = false;
        while( true ) {
          if (((9 < iVar5 - 0x30U) && (iVar5 != 0x2d)) && (!(bool)(iVar5 == 0x2e & (bVar3 ^ 1U)))) {
            buf[lVar12] = '\0';
            if (!bVar3) {
              pSVar7 = SExprAlloc(parser,SE_INT);
              lVar12 = strtol(buf,(char **)0x0,10);
              (pSVar7->field_2).i = (int)lVar12;
              return pSVar7;
            }
            pSVar7 = SExprAlloc(parser,SE_FLOAT);
            dVar13 = strtod(buf,(char **)0x0);
            (pSVar7->field_2).f = (float)dVar13;
            return pSVar7;
          }
          if (lVar12 == 0x1f) break;
          bVar3 = (bool)(bVar3 | iVar5 == 0x2e);
          buf[lVar12] = (char)iVar5;
          lVar12 = lVar12 + 1;
          iVar5 = SExprGetChar(parser);
          parser->last = iVar5;
        }
        (parser->result).type = SE_SYNTAX_ERROR;
        pcVar8 = "Numeric literal is too long.";
        goto LAB_00105624;
      }
      if (iVar5 == 0x22) {
        pSVar7 = SExprAlloc(parser,SE_STRING);
        (pSVar7->field_2).s.len = 0;
        (pSVar7->field_2).i = parser->pos;
        goto LAB_00105929;
      }
      if (iVar5 == 0x28) goto LAB_00105785;
      if (iVar5 == 0x2d) {
        if (((ulong)(long)parser->pos < parser->len) && ((int)parser->src[parser->pos] - 0x30U < 10)
           ) goto LAB_001056c3;
      }
      else if ((iVar5 == 0x7b) || (iVar5 == 0x5b)) goto LAB_00105785;
      (parser->result).type = SE_SYNTAX_ERROR;
      pcVar8 = "Unexpected character";
      goto LAB_00105624;
    }
    if (iVar5 == 10) {
      parser->lineNumber = parser->lineNumber + 1;
    }
    iVar5 = SExprGetChar(parser);
    parser->last = iVar5;
  }
  (parser->result).type = SE_SYNTAX_ERROR;
  pcVar8 = "Unexpected EOF";
  goto LAB_00105624;
LAB_00105929:
  iVar5 = SExprGetChar(parser);
  parser->last = iVar5;
  if (iVar5 == 0) goto LAB_0010596a;
  if (iVar5 == 0x22) goto LAB_0010595a;
  piVar1 = &(pSVar7->field_2).s.len;
  *piVar1 = *piVar1 + 1;
  goto LAB_00105929;
LAB_0010596a:
  (parser->result).type = SE_SYNTAX_ERROR;
  pcVar8 = "Unexpected EOF when expecting end of string.";
  goto LAB_00105624;
LAB_00105785:
  iVar5 = SExprGetChar(parser);
  parser->last = iVar5;
  if (iVar5 != 0) {
    iVar4 = isspace(iVar5);
    if (iVar4 == 0) {
      if (((iVar5 == 0x7d) || (iVar5 == 0x29)) || (iVar5 == 0x5d)) {
        iVar5 = SExprGetChar(parser);
        parser->last = iVar5;
        return &SExprParseValue::nil;
      }
      if (iVar5 != 0) {
        pSVar7 = SExprAlloc(parser,SE_LIST);
        iVar5 = parser->last;
        pSVar11 = (SExpr *)0x0;
        while (iVar5 != 0) {
          if (((iVar5 == 0x29) || (iVar5 == 0x5d)) || (iVar5 == 0x7d)) {
LAB_0010595a:
            iVar5 = SExprGetChar(parser);
            parser->last = iVar5;
            return pSVar7;
          }
          pSVar9 = SExprParseValue(parser);
          if (pSVar9 == (SExpr *)0x0) {
            return (SExpr *)0x0;
          }
          paVar10 = (anon_union_8_5_1f899604_for_SExpr_2 *)&pSVar11->next;
          if (pSVar11 == (SExpr *)0x0) {
            paVar10 = &pSVar7->field_2;
          }
          paVar10->head = pSVar9;
          iVar5 = parser->last;
          while ((pSVar11 = pSVar9, iVar5 != 0 && (iVar4 = isspace(iVar5), iVar4 != 0))) {
            if (iVar5 == 10) {
              parser->lineNumber = parser->lineNumber + 1;
            }
            iVar5 = SExprGetChar(parser);
            parser->last = iVar5;
          }
        }
        (parser->result).type = SE_SYNTAX_ERROR;
        pcVar8 = "Unexpected EOF when expecting end of list.";
        goto LAB_00105624;
      }
      goto LAB_00105794;
    }
    if (iVar5 == 10) {
      parser->lineNumber = parser->lineNumber + 1;
    }
    goto LAB_00105785;
  }
LAB_00105794:
  (parser->result).type = SE_SYNTAX_ERROR;
  pcVar8 = "Unexpected EOF when expecting \')\' or list elements.";
LAB_00105624:
  (parser->result).field_1.expr = (SExpr *)pcVar8;
  return (SExpr *)0x0;
}

Assistant:

SEXPR_DEF SExpr* SExprParseValue(SExprParser* parser)
{
    while(parser->last && isspace(parser->last)) {
        if(parser->last == '\n') {
            parser->lineNumber++;
        }

        parser->last = SExprGetChar(parser);
    }

    if(!parser->last) {
        parser->result.type = SE_SYNTAX_ERROR;
        parser->result.syntaxError.message = "Unexpected EOF";

        return NULL;
    }

    if(isalpha(parser->last)) {
        SExprString s;

        s.len = 0;
        s.start = parser->pos - 1;

        while(isalnum(parser->last) || parser->last == '-' ||
                parser->last == '+' || parser->last == '/' ||
                parser->last == '*' || parser->last == '$' ||
                parser->last == '?' || parser->last == '_' ||
                parser->last == '=') {
            s.len++;
            parser->last = SExprGetChar(parser);
        }

        if(SExprStringEqual(parser->src, &s, "true")) {
            static SExpr strue = {SE_BOOL};
            strue.b = true;

            return &strue;
        } else if(SExprStringEqual(parser->src, &s, "false")) {
            static SExpr sfalse = {SE_BOOL};
            sfalse.b = false;
            
            return &sfalse;
        }

        SExpr* expr = SExprAlloc(parser, SE_ID);
        expr->s = s;

        return expr;
    } else if(isdigit(parser->last) || (parser->last == '-' && isdigit(SExprPeek(parser)))) {
        int i = 0;
        char buf[32];

        bool isFloat = false;

        while(isdigit(parser->last) || (!isFloat && parser->last == '.') || parser->last == '-') {
            if(i >= sizeof(buf) - 1) {
                parser->result.type = SE_SYNTAX_ERROR;
                parser->result.syntaxError.message = "Numeric literal is too long.";
                return NULL;
            }

            if(parser->last == '.') {
                isFloat = true;
            }

            buf[i++] = parser->last;
            parser->last = SExprGetChar(parser);
        }

        buf[i] = '\0';

        if(isFloat) {
            SExpr* expr = SExprAlloc(parser, SE_FLOAT);
            expr->f = (float)strtod(buf, NULL);
            return expr;
        }    

        SExpr* expr = SExprAlloc(parser, SE_INT);
        expr->i = strtol(buf, NULL, 10);
        return expr;
    } else if(parser->last == '"') {
        SExpr* expr = SExprAlloc(parser, SE_STRING);

        expr->s.len = 0;
        expr->s.start = parser->pos;

        parser->last = SExprGetChar(parser);

        while(parser->last && parser->last != '"') {
            expr->s.len++;
            parser->last = SExprGetChar(parser);
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting end of string.";
            return NULL;
        }

        parser->last = SExprGetChar(parser);

        return expr;
    } else if(parser->last == '(' || parser->last == '[' || parser->last == '{') {
        parser->last = SExprGetChar(parser);

        while(parser->last && isspace(parser->last)) {
			if(parser->last == '\n') {
				parser->lineNumber++;
			}
            parser->last = SExprGetChar(parser);
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting ')' or list elements.";
            return NULL;
        }

        if(parser->last == ')' || parser->last == ']' || parser->last == '}') {
            parser->last = SExprGetChar(parser);
            
            static SExpr nil = {SE_NIL};
            return &nil;
        }

        SExpr* list = SExprAlloc(parser, SE_LIST);
        SExpr* tail = NULL;

        while(parser->last && parser->last != ')' && parser->last != ']' && parser->last != '}') {
            SExpr* elem = SExprParseValue(parser);

            if(!elem) {
                // There must have been an error
                return NULL;
            }

            if(!tail) {
                list->head = tail = elem;
            } else {
                tail->next = elem;
				tail = elem;
            }

			while(parser->last && isspace(parser->last)) {		
				if(parser->last == '\n') {
					parser->lineNumber++;
				}
				parser->last = SExprGetChar(parser);
			}
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting end of list.";
            return NULL;
        }

        parser->last = SExprGetChar(parser);

        return list;
    }

    parser->result.type = SE_SYNTAX_ERROR;
    parser->result.syntaxError.message = "Unexpected character";
    return NULL;
}